

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O3

void __thiscall level_tools::~level_tools(level_tools *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  xr_ini_file *this_00;
  pointer pcVar2;
  pointer ppxVar3;
  pointer puVar4;
  
  (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__level_tools_00246260;
  (this->super_xr_surface_factory)._vptr_xr_surface_factory =
       (_func_int **)&PTR__level_tools_00246290;
  this_00 = this->m_ini;
  if (this_00 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(this_00);
  }
  operator_delete(this_00,0x18);
  if (this->m_shaders_xrlc_lib != (xr_shaders_xrlc_lib *)0x0) {
    (*this->m_shaders_xrlc_lib->_vptr_xr_shaders_xrlc_lib[1])();
  }
  if (this->m_scene != (xr_scene *)0x0) {
    (*this->m_scene->_vptr_xr_scene[1])();
  }
  if (this->m_level != (xr_level *)0x0) {
    (*this->m_level->_vptr_xr_level[1])();
  }
  pcVar2 = (this->m_objects_ref)._M_dataplus._M_p;
  paVar1 = &(this->m_objects_ref).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppxVar3 = (this->m_mu_models).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppxVar3 != (pointer)0x0) {
    operator_delete(ppxVar3,(long)(this->m_mu_models).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar3
                   );
  }
  puVar4 = (this->m_uniq_shaders).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_uniq_shaders).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->m_uniq_textures).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_uniq_textures).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
    return;
  }
  return;
}

Assistant:

level_tools::~level_tools()
{
	delete m_ini;
	delete m_shaders_xrlc_lib;
	delete m_scene;
	delete m_level;
}